

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

int xmlPythonFileClose(void *context)

{
  int iVar1;
  long *plVar2;
  char *pcVar3;
  
  if (context == (void *)0x0) {
    return -1;
  }
  pcVar3 = "io_close";
  iVar1 = PyObject_HasAttrString(context,"io_close");
  if (iVar1 == 0) {
    pcVar3 = "flush";
    iVar1 = PyObject_HasAttrString(context,"flush");
    if (iVar1 == 0) {
      plVar2 = (long *)0x0;
      goto LAB_0013c382;
    }
  }
  plVar2 = (long *)_PyObject_CallMethod_SizeT(context,pcVar3,"()");
LAB_0013c382:
  if ((plVar2 != (long *)0x0) && (*plVar2 = *plVar2 + -1, *plVar2 == 0)) {
    _Py_Dealloc(plVar2);
  }
  return 0;
}

Assistant:

static int
xmlPythonFileClose (void * context) {
    PyObject *file, *ret = NULL;

    file = (PyObject *) context;
    if (file == NULL) return(-1);
    if (PyObject_HasAttrString(file, (char *) "io_close")) {
        ret = PyObject_CallMethod(file, (char *) "io_close", (char *) "()");
    } else if (PyObject_HasAttrString(file, (char *) "flush")) {
        ret = PyObject_CallMethod(file, (char *) "flush", (char *) "()");
    }
    if (ret != NULL) {
	Py_DECREF(ret);
    }
    return(0);
}